

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

void MCTS::assertion_failed(char *expr,char *file_cstr,int line)

{
  ostream *poVar1;
  runtime_error *this;
  string file;
  char *local_1d0;
  stringstream sout;
  ostream local_1a0 [376];
  
  std::__cxx11::string::string((string *)&file,file_cstr,(allocator *)&sout);
  std::__cxx11::string::find_last_of((char *)&file,0x113190);
  std::__cxx11::string::substr((ulong)&sout,(ulong)&file);
  std::__cxx11::string::operator=((string *)&file,(string *)&sout);
  std::__cxx11::string::~string((string *)&sout);
  std::__cxx11::stringstream::stringstream((stringstream *)&sout);
  poVar1 = std::operator<<(local_1a0,"Assertion failed: ");
  poVar1 = std::operator<<(poVar1,expr);
  poVar1 = std::operator<<(poVar1," in ");
  poVar1 = std::operator<<(poVar1,(string *)&file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  std::operator<<(poVar1,".");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void assertion_failed(const char* expr, const char* file_cstr, int line)
{
	using namespace std;

	// Extract the file name only.
	string file(file_cstr);
	auto pos = file.find_last_of("/\\");
	if (pos == string::npos) {
		pos = 0;
	}
	file = file.substr(pos + 1);  // Returns empty string if pos + 1 == length.

	stringstream sout;
	sout << "Assertion failed: " << expr << " in " << file << ":" << line << ".";
	throw runtime_error(sout.str().c_str());
}